

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall
QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate
          (QHttpNetworkRequestPrivate *this,Operation op,Priority pri,QUrl *newUrl)

{
  int in_EDX;
  __atomic_base<int> in_ESI;
  QHttpNetworkHeaderPrivate *in_RDI;
  QUrl *in_stack_ffffffffffffffd8;
  
  QHttpNetworkHeaderPrivate::QHttpNetworkHeaderPrivate(in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[1].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = in_ESI._M_i;
  QByteArray::QByteArray((QByteArray *)0x308e83);
  QString::QString((QString *)0x308e91);
  in_RDI[1].parser.minorVersion = in_EDX;
  in_RDI[1].parser.maxFieldSize = 0;
  *(undefined1 *)&in_RDI[1].parser.maxTotalSize = 0;
  *(undefined1 *)((long)&in_RDI[1].parser.maxTotalSize + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1].parser.maxTotalSize + 2) = 1;
  *(undefined1 *)((long)&in_RDI[1].parser.maxTotalSize + 3) = 0;
  *(undefined1 *)((long)&in_RDI[1].parser.maxTotalSize + 4) = 0;
  *(undefined1 *)((long)&in_RDI[1].parser.maxTotalSize + 5) = 1;
  *(undefined1 *)((long)&in_RDI[1].parser.maxTotalSize + 6) = 0;
  *(undefined1 *)((long)&in_RDI[1].parser.maxTotalSize + 7) = 0;
  *(undefined1 *)&in_RDI[1].parser.maxFieldCount = 0;
  *(undefined4 *)((long)&in_RDI[1].parser.maxFieldCount + 4) = 0;
  in_RDI[2].super_QSharedData.ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QString::QString((QString *)0x308f0a);
  return;
}

Assistant:

QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate(QHttpNetworkRequest::Operation op,
        QHttpNetworkRequest::Priority pri, const QUrl &newUrl)
    : QHttpNetworkHeaderPrivate(newUrl), operation(op), priority(pri), uploadByteDevice(nullptr),
      autoDecompress(false), pipeliningAllowed(false), http2Allowed(true),
      http2Direct(false), withCredentials(true), preConnect(false), redirectCount(0),
      redirectPolicy(QNetworkRequest::ManualRedirectPolicy)
{
}